

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>::format
          (source_linenum_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  format_decimal_result<char_*> fVar5;
  scoped_padder p;
  scoped_padder local_60;
  char local_38 [21];
  char acStack_23 [3];
  char *local_20;
  
  if ((msg->source).line == 0) {
    scoped_padder::scoped_padder(&local_60,0,&(this->super_flag_formatter).padinfo_,dest);
  }
  else {
    uVar1 = (msg->source).line;
    uVar3 = uVar1 | 1;
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    scoped_padder::scoped_padder
              (&local_60,
               (ulong)uVar1 +
               *(long *)(fmt::v9::detail::do_count_digits(unsigned_int)::table + (ulong)uVar2 * 8)
               >> 0x20,&(this->super_flag_formatter).padinfo_,dest);
    uVar1 = (msg->source).line;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    fVar5 = fmt::v9::detail::format_decimal<char,unsigned_int>(local_38,uVar2,0x15);
    local_20 = fVar5.begin;
    if ((int)uVar1 < 0) {
      local_20[-1] = '-';
      local_20 = local_20 + -1;
    }
    lVar4 = (long)local_38 - (long)local_20;
    if (lVar4 < -0x15) {
      fmt::v9::detail::assert_fail
                ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                 ,0x199,"negative value");
    }
    fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,local_20 + lVar4 + 0x15);
  }
  scoped_padder::~scoped_padder(&local_60);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        auto field_size = ScopedPadder::count_digits(msg.source.line);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.source.line, dest);
    }